

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeRTASBuilderCreateExt
          (ze_driver_handle_t hDriver,ze_rtas_builder_ext_desc_t *pDescriptor,
          ze_rtas_builder_ext_handle_t *phBuilder)

{
  ze_rtas_builder_ext_handle_t p_Var1;
  ze_pfnRTASBuilderCreateExt_t pfnCreateExt;
  ze_result_t result;
  ze_rtas_builder_ext_handle_t *phBuilder_local;
  ze_rtas_builder_ext_desc_t *pDescriptor_local;
  ze_driver_handle_t hDriver_local;
  
  pfnCreateExt._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c138 == (code *)0x0) {
    p_Var1 = (ze_rtas_builder_ext_handle_t)context_t::get((context_t *)&context);
    *phBuilder = p_Var1;
  }
  else {
    pfnCreateExt._4_4_ = (*DAT_0011c138)(hDriver,pDescriptor,phBuilder);
  }
  return pfnCreateExt._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeRTASBuilderCreateExt(
        ze_driver_handle_t hDriver,                     ///< [in] handle of driver object
        const ze_rtas_builder_ext_desc_t* pDescriptor,  ///< [in] pointer to builder descriptor
        ze_rtas_builder_ext_handle_t* phBuilder         ///< [out] handle of builder object
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnCreateExt = context.zeDdiTable.RTASBuilder.pfnCreateExt;
        if( nullptr != pfnCreateExt )
        {
            result = pfnCreateExt( hDriver, pDescriptor, phBuilder );
        }
        else
        {
            // generic implementation
            *phBuilder = reinterpret_cast<ze_rtas_builder_ext_handle_t>( context.get() );

        }

        return result;
    }